

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void Acb_VerilogSimpleWrite(Acb_Ntk_t *p,char *pFileName)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  pcVar4 = Acb_NtkName(p);
  fprintf(__stream,"\nmodule %s (\n  ",pcVar4);
  for (iVar8 = 0; iVar8 < (p->vCis).nSize - p->nRegs; iVar8 = iVar8 + 1) {
    iVar1 = Vec_IntEntry(&p->vCis,iVar8);
    pcVar4 = Acb_ObjNameStr(p,iVar1);
    fprintf(__stream,"%s, ",pcVar4);
  }
  fwrite("\n  ",3,1,__stream);
  pcVar4 = "T = %d\t\t";
  for (iVar8 = 0; iVar8 < (p->vCos).nSize - p->nRegs; iVar8 = iVar8 + 1) {
    iVar1 = Vec_IntEntry(&p->vCos,iVar8);
    pcVar5 = Acb_ObjNameStr(p,iVar1);
    fprintf(__stream,"%s%s",pcVar4 + 8,pcVar5);
    pcVar4 = "    \"%s\", ";
  }
  fwrite("\n);\n\n",5,1,__stream);
  for (iVar8 = 0; iVar8 < (p->vCis).nSize - p->nRegs; iVar8 = iVar8 + 1) {
    iVar1 = Vec_IntEntry(&p->vCis,iVar8);
    pcVar4 = Acb_ObjNameStr(p,iVar1);
    fprintf(__stream,"  input %s;\n",pcVar4);
  }
  fputc(10,__stream);
  for (iVar8 = 0; iVar8 < (p->vCos).nSize - p->nRegs; iVar8 = iVar8 + 1) {
    iVar1 = Vec_IntEntry(&p->vCos,iVar8);
    pcVar4 = Acb_ObjNameStr(p,iVar1);
    fprintf(__stream,"  output %s;\n",pcVar4);
  }
  fputc(10,__stream);
  for (iVar8 = 1; iVar8 < (p->vObjType).nSize; iVar8 = iVar8 + 1) {
    AVar2 = Acb_ObjType(p,iVar8);
    if (AVar2 != ABC_OPER_NONE) {
      iVar1 = Acb_ObjIsCio(p,iVar8);
      if (iVar1 == 0) {
        iVar1 = Acb_ObjFaninNum(p,iVar8);
        if (0 < iVar1) {
          pcVar4 = Acb_ObjNameStr(p,iVar8);
          fprintf(__stream,"  wire %s;\n",pcVar4);
        }
      }
    }
  }
  fputc(10,__stream);
  iVar8 = 1;
  do {
    if ((p->vObjType).nSize <= iVar8) {
      fwrite("\nendmodule\n\n",0xc,1,__stream);
      fclose(__stream);
      return;
    }
    AVar2 = Acb_ObjType(p,iVar8);
    if (AVar2 != ABC_OPER_NONE) {
      iVar1 = Acb_ObjIsCio(p,iVar8);
      if (iVar1 == 0) {
        iVar1 = Acb_ObjFaninNum(p,iVar8);
        if (iVar1 < 1) {
          AVar2 = Acb_ObjType(p,iVar8);
          if (AVar2 != ABC_OPER_CONST_F) {
            AVar2 = Acb_ObjType(p,iVar8);
            if (AVar2 != ABC_OPER_CONST_T) {
              __assert_fail("Acb_ObjType(p, iObj) == ABC_OPER_CONST_F || Acb_ObjType(p, iObj) == ABC_OPER_CONST_T"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                            ,0x1cc,"void Acb_VerilogSimpleWrite(Acb_Ntk_t *, char *)");
            }
          }
          fprintf(__stream,"  %s (","buf");
          AVar2 = Acb_ObjType(p,iVar8);
          if (AVar2 == ABC_OPER_CONST_X) {
            fwrite(" 1\'bx",5,1,__stream);
          }
          else {
            AVar2 = Acb_ObjType(p,iVar8);
            fprintf(__stream," 1\'b%d",(ulong)(AVar2 == ABC_OPER_CONST_T));
          }
          fwrite(" );\n",4,1,__stream);
        }
        else {
          lVar6 = ftell(__stream);
          AVar2 = Acb_ObjType(p,iVar8);
          pcVar4 = Acb_Oper2Name(AVar2);
          fprintf(__stream,"  %s (",pcVar4);
          pcVar4 = Acb_ObjNameStr(p,iVar8);
          fprintf(__stream," %s",pcVar4);
          piVar7 = Acb_ObjFanins(p,iVar8);
          for (lVar9 = 0; lVar9 < *piVar7; lVar9 = lVar9 + 1) {
            pcVar4 = Acb_ObjNameStr(p,piVar7[lVar9 + 1]);
            fprintf(__stream,", %s",pcVar4);
          }
          fwrite(" );",3,1,__stream);
          if (0 < (p->vObjWeight).nSize) {
            iVar1 = Acb_ObjWeight(p,iVar8);
            if (0 < iVar1) {
              lVar9 = ftell(__stream);
              uVar3 = Acb_ObjWeight(p,iVar8);
              fprintf(__stream," %*s // weight = %d",(ulong)(((int)lVar6 - (int)lVar9) + 0x37),"",
                      (ulong)uVar3);
            }
          }
          fputc(10,__stream);
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void Acb_VerilogSimpleWrite( Acb_Ntk_t * p, char * pFileName )
{
    int i, iObj, fFirst = 1;
    FILE * pFile = fopen( pFileName, "wb" ); 
    if ( pFile == NULL ) { printf( "Cannot open file \"%s\" for writing.\n", pFileName ); return; }

    fprintf( pFile, "\nmodule %s (\n  ", Acb_NtkName(p) );

    Acb_NtkForEachPi( p, iObj, i )
        fprintf( pFile, "%s, ", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n  " );

    Acb_NtkForEachPo( p, iObj, i )
        fprintf( pFile, "%s%s", fFirst ? "":", ", Acb_ObjNameStr(p, iObj) ), fFirst = 0;
    fprintf( pFile, "\n);\n\n" );

    Acb_NtkForEachPi( p, iObj, i )
        fprintf( pFile, "  input %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachPo( p, iObj, i )
        fprintf( pFile, "  output %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachNode( p, iObj )
        if ( Acb_ObjFaninNum(p, iObj) > 0 )
            fprintf( pFile, "  wire %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachNode( p, iObj )
        if ( Acb_ObjFaninNum(p, iObj) > 0 )
        {
            int * pFanin, iFanin, k, start = ftell(pFile)+55;
            fprintf( pFile, "  %s (", Acb_Oper2Name( Acb_ObjType(p, iObj) ) );
            fprintf( pFile, " %s", Acb_ObjNameStr(p, iObj) );
            Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
                //if ( iFanin == 0 ) fprintf( pFile, ", <zero>" ); else
                fprintf( pFile, ", %s", Acb_ObjNameStr(p, iFanin) );
            fprintf( pFile, " );" );
            if ( Acb_NtkHasObjWeights(p) && Acb_ObjWeight(p, iObj) > 0 )
                fprintf( pFile, " %*s // weight = %d", (int)(start-ftell(pFile)), "", Acb_ObjWeight(p, iObj) );
            fprintf( pFile, "\n" );
        }
        else // constant nodes
        {
            assert( Acb_ObjType(p, iObj) == ABC_OPER_CONST_F || Acb_ObjType(p, iObj) == ABC_OPER_CONST_T );
            fprintf( pFile, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            if ( Acb_ObjType(p, iObj) == ABC_OPER_CONST_X )
                fprintf( pFile, " 1\'bx" );
            else
                fprintf( pFile, " 1\'b%d", Acb_ObjType(p, iObj) == ABC_OPER_CONST_T );
            fprintf( pFile, " );\n" );
        }

    fprintf( pFile, "\nendmodule\n\n" );
    fclose( pFile );
}